

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

bool __thiscall
GlobOpt::GetHash(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,
                ExprAttributes exprAttributes,ExprHash *pHash)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Opnd *pOVar4;
  JITTimeFunctionBody *pJVar5;
  char16 *pcVar6;
  ValueNumber local_44;
  ValueNumber local_40;
  ValueNumber valNum2;
  ValueNumber valNum1;
  OpCode opcode;
  ExprHash *pHash_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  ExprAttributes exprAttributes_local;
  
  valNum2._2_2_ = instr->m_opcode;
  bVar1 = OpCodeAttr::CanCSE(valNum2._2_2_);
  if (((!bVar1) && (valNum2._2_2_ != StElemI_A)) && (valNum2._2_2_ != StElemI_A_Strict)) {
    return false;
  }
  local_40 = 0;
  local_44 = 0;
  pOVar4 = IR::Instr::GetSrc1(instr);
  if (pOVar4 != (Opnd *)0x0) {
    if (src1Val == (Value *)0x0) {
      return false;
    }
    local_40 = ::Value::GetValueNumber(src1Val);
    pOVar4 = IR::Instr::GetSrc2(instr);
    if (pOVar4 != (Opnd *)0x0) {
      if (src2Val == (Value *)0x0) {
        return false;
      }
      local_44 = ::Value::GetValueNumber(src2Val);
    }
  }
  if ((src1Val != (Value *)0x0) &&
     (local_40 = ::Value::GetValueNumber(src1Val), src2Val != (Value *)0x0)) {
    local_44 = ::Value::GetValueNumber(src2Val);
  }
  if (valNum2._2_2_ == Ld_A) {
LAB_005fc1e4:
    this_local._7_1_ = false;
  }
  else {
    if ((valNum2._2_2_ == StElemI_A) || (valNum2._2_2_ == StElemI_A_Strict)) {
      valNum2._2_2_ = LdElemI_A;
    }
    else if (valNum2._2_2_ == Neg_I4) {
      valNum2._2_2_ = Neg_A;
    }
    else if (valNum2._2_2_ == Not_I4) {
      valNum2._2_2_ = Not_A;
    }
    else if (valNum2._2_2_ == Add_I4) {
      valNum2._2_2_ = Add_A;
    }
    else if (valNum2._2_2_ == Sub_I4) {
      valNum2._2_2_ = Sub_A;
    }
    else if (valNum2._2_2_ == Mul_I4) {
      valNum2._2_2_ = Mul_A;
    }
    else if (valNum2._2_2_ == Div_I4) {
      valNum2._2_2_ = Div_A;
    }
    else if (valNum2._2_2_ == Rem_I4) {
      valNum2._2_2_ = Rem_A;
    }
    else if (valNum2._2_2_ == And_I4) {
      valNum2._2_2_ = And_A;
    }
    else if (valNum2._2_2_ == Or_I4) {
      valNum2._2_2_ = Or_A;
    }
    else if (valNum2._2_2_ == Xor_I4) {
      valNum2._2_2_ = Xor_A;
    }
    else if (valNum2._2_2_ == Shl_I4) {
      valNum2._2_2_ = Shl_A;
    }
    else if (valNum2._2_2_ == Shr_I4) {
      valNum2._2_2_ = Shr_A;
    }
    else if (valNum2._2_2_ == ShrU_I4) {
      valNum2._2_2_ = ShrU_A;
    }
    else if (valNum2._2_2_ == CmEq_I4) {
      valNum2._2_2_ = CmEq_A;
    }
    else if (valNum2._2_2_ == CmNeq_I4) {
      valNum2._2_2_ = CmNeq_A;
    }
    else if (valNum2._2_2_ == CmLt_I4) {
      valNum2._2_2_ = CmLt_A;
    }
    else if (valNum2._2_2_ == CmLe_I4) {
      valNum2._2_2_ = CmLe_A;
    }
    else if (valNum2._2_2_ == CmGt_I4) {
      valNum2._2_2_ = CmGt_A;
    }
    else if (valNum2._2_2_ == CmGe_I4) {
      valNum2._2_2_ = CmGe_A;
    }
    else if (valNum2._2_2_ == CmUnLt_I4) {
      valNum2._2_2_ = CmUnLt_A;
    }
    else if (valNum2._2_2_ == CmUnLe_I4) {
      valNum2._2_2_ = CmUnLe_A;
    }
    else if (valNum2._2_2_ == CmUnGt_I4) {
      valNum2._2_2_ = CmUnGt_A;
    }
    else if (valNum2._2_2_ == CmUnGe_I4) {
      valNum2._2_2_ = CmUnGe_A;
    }
    else if (valNum2._2_2_ == Ld_I4) goto LAB_005fc1e4;
    ExprHash::Init(pHash,valNum2._2_2_,local_40,local_44,exprAttributes);
    bVar1 = ExprHash::IsValid(pHash);
    if (!bVar1) {
      uVar2 = Func::GetSourceContextId(this->func);
      uVar3 = Func::GetLocalFunctionId(this->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,CSEPhase,uVar2,uVar3);
      if (bVar1) {
        pJVar5 = Func::GetJITFunctionBody(this->func);
        pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar5);
        Output::Print(L" >>>>  CSE: Value numbers too big to be hashed in function %s!\n",pcVar6);
      }
    }
    bVar1 = ExprHash::IsValid(pHash);
    if (!bVar1) {
      uVar2 = Func::GetSourceContextId(this->func);
      uVar3 = Func::GetLocalFunctionId(this->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,CSEPhase,uVar2,uVar3);
      if (bVar1) {
        pJVar5 = Func::GetJITFunctionBody(this->func);
        pcVar6 = JITTimeFunctionBody::GetDisplayName(pJVar5);
        Output::Print(L" >>>>  CSE: Value numbers too big to be hashed in function %s!\n",pcVar6);
      }
    }
    this_local._7_1_ = ExprHash::IsValid(pHash);
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::GetHash(IR::Instr *instr, Value *src1Val, Value *src2Val, ExprAttributes exprAttributes, ExprHash *pHash)
{
    Js::OpCode opcode = instr->m_opcode;

    // Candidate?
    if (!OpCodeAttr::CanCSE(opcode) && (opcode != Js::OpCode::StElemI_A && opcode != Js::OpCode::StElemI_A_Strict))
    {
        return false;
    }

    ValueNumber valNum1 = 0;
    ValueNumber valNum2 = 0;

    // Get the value number of src1 and src2
    if (instr->GetSrc1())
    {
        if (!src1Val)
        {
            return false;
        }
        valNum1 = src1Val->GetValueNumber();
        if (instr->GetSrc2())
        {
            if (!src2Val)
            {
                return false;
            }
            valNum2 = src2Val->GetValueNumber();
        }
    }

    if (src1Val)
    {
        valNum1 = src1Val->GetValueNumber();
        if (src2Val)
        {
            valNum2 = src2Val->GetValueNumber();
        }
    }

    switch (opcode)
    {
    case Js::OpCode::Ld_I4:
    case Js::OpCode::Ld_A:
        // Copy-prop should handle these
        return false;
    case Js::OpCode::Add_I4:
        opcode = Js::OpCode::Add_A;
        break;
    case Js::OpCode::Sub_I4:
        opcode = Js::OpCode::Sub_A;
        break;
    case Js::OpCode::Mul_I4:
        opcode = Js::OpCode::Mul_A;
        break;
    case Js::OpCode::Rem_I4:
        opcode = Js::OpCode::Rem_A;
        break;
    case Js::OpCode::Div_I4:
        opcode = Js::OpCode::Div_A;
        break;
    case Js::OpCode::Neg_I4:
        opcode = Js::OpCode::Neg_A;
        break;
    case Js::OpCode::Not_I4:
        opcode = Js::OpCode::Not_A;
        break;
    case Js::OpCode::And_I4:
        opcode = Js::OpCode::And_A;
        break;
    case Js::OpCode::Or_I4:
        opcode = Js::OpCode::Or_A;
        break;
    case Js::OpCode::Xor_I4:
        opcode = Js::OpCode::Xor_A;
        break;
    case Js::OpCode::Shl_I4:
        opcode = Js::OpCode::Shl_A;
        break;
    case Js::OpCode::Shr_I4:
        opcode = Js::OpCode::Shr_A;
        break;
    case Js::OpCode::ShrU_I4:
        opcode = Js::OpCode::ShrU_A;
        break;
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        // Make the load available as a CSE
        opcode = Js::OpCode::LdElemI_A;
        break;
    case Js::OpCode::CmEq_I4:
        opcode = Js::OpCode::CmEq_A;
        break;
    case Js::OpCode::CmNeq_I4:
        opcode = Js::OpCode::CmNeq_A;
        break;
    case Js::OpCode::CmLt_I4:
        opcode = Js::OpCode::CmLt_A;
        break;
    case Js::OpCode::CmLe_I4:
        opcode = Js::OpCode::CmLe_A;
        break;
    case Js::OpCode::CmGt_I4:
        opcode = Js::OpCode::CmGt_A;
        break;
    case Js::OpCode::CmGe_I4:
        opcode = Js::OpCode::CmGe_A;
        break;
    case Js::OpCode::CmUnLt_I4:
        opcode = Js::OpCode::CmUnLt_A;
        break;
    case Js::OpCode::CmUnLe_I4:
        opcode = Js::OpCode::CmUnLe_A;
        break;
    case Js::OpCode::CmUnGt_I4:
        opcode = Js::OpCode::CmUnGt_A;
        break;
    case Js::OpCode::CmUnGe_I4:
        opcode = Js::OpCode::CmUnGe_A;
        break;
    }

    pHash->Init(opcode, valNum1, valNum2, exprAttributes);

#if DBG_DUMP
    if (!pHash->IsValid() && Js::Configuration::Global.flags.Trace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" >>>>  CSE: Value numbers too big to be hashed in function %s!\n"), this->func->GetJITFunctionBody()->GetDisplayName());
    }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (!pHash->IsValid() && Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" >>>>  CSE: Value numbers too big to be hashed in function %s!\n"), this->func->GetJITFunctionBody()->GetDisplayName());
    }
#endif

    return pHash->IsValid();
}